

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O2

float duckdb::Cast::Operation<duckdb::string_t,float>(string_t input)

{
  string_t input_00;
  bool bVar1;
  InvalidInputException *this;
  PhysicalType type;
  bool in_R8B;
  string_t input_01;
  undefined4 uStack_c8;
  float result;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  input_01.value._0_8_ = input.value._8_8_;
  input_01.value.pointer.ptr = (char *)&result;
  bVar1 = TryCast::Operation<duckdb::string_t,float>(input.value._0_8_,input_01,(float *)0x0,in_R8B)
  ;
  if (bVar1) {
    return result;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  input_00.value._8_4_ = uStack_c8;
  input_00.value._0_8_ = 0x2ca114;
  input_00.value._12_4_ = result;
  ConvertToString::Operation<duckdb::string_t>(input_00);
  ::std::operator+(&local_80,"Could not convert string \'",&local_a0);
  ::std::operator+(&local_60,&local_80,"\' to ");
  TypeIdToString_abi_cxx11_(&local_c0,(duckdb *)0xb,type);
  ::std::operator+(&local_40,&local_60,&local_c0);
  ::std::__cxx11::string::~string((string *)&local_c0);
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::__cxx11::string::~string((string *)&local_80);
  ::std::__cxx11::string::~string((string *)&local_a0);
  InvalidInputException::InvalidInputException(this,&local_40);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline DST Operation(SRC input) {
		DST result;
		if (!TryCast::Operation(input, result)) {
			throw InvalidInputException(CastExceptionText<SRC, DST>(input));
		}
		return result;
	}